

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O1

char * clib_check_lds(lua_State *L,char *buf)

{
  char *pcVar1;
  int iVar2;
  char *str;
  GCstr *pGVar3;
  size_t lenx;
  
  iVar2 = strncmp(buf,"GROUP",5);
  if (((iVar2 == 0) || (iVar2 = strncmp(buf,"INPUT",5), iVar2 == 0)) &&
     (str = strchr(buf,0x28), str != (char *)0x0)) {
    do {
      pcVar1 = str + 1;
      str = str + 1;
    } while (*pcVar1 == ' ');
    lenx = 0;
    while ((0x29 < (ulong)(byte)str[lenx] ||
           ((0x20100000001U >> ((ulong)(byte)str[lenx] & 0x3f) & 1) == 0))) {
      lenx = lenx + 1;
    }
    pGVar3 = lj_str_new(L,str,lenx);
    return (char *)(pGVar3 + 1);
  }
  return (char *)0x0;
}

Assistant:

static const char *clib_check_lds(lua_State *L, const char *buf)
{
  char *p, *e;
  if ((!strncmp(buf, "GROUP", 5) || !strncmp(buf, "INPUT", 5)) &&
      (p = strchr(buf, '('))) {
    while (*++p == ' ') ;
    for (e = p; *e && *e != ' ' && *e != ')'; e++) ;
    return strdata(lj_str_new(L, p, e-p));
  }
  return NULL;
}